

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O3

int __thiscall Imf_3_2::DeepTiledInputFile::numLevels(DeepTiledInputFile *this)

{
  char *pcVar1;
  ostream *poVar2;
  LogicExc *this_00;
  stringstream _iex_throw_s;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  if ((this->_data->tileDesc).mode != RIPMAP_LEVELS) {
    return this->_data->numXLevels;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(asStack_198);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_188,"Error calling numLevels() on image file \"",0x29);
  pcVar1 = IStream::fileName(this->_data->_streamData->is);
  poVar2 = std::operator<<(local_188,pcVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"\" (numLevels() is not defined for files with RIPMAP level mode).",0x40);
  this_00 = (LogicExc *)__cxa_allocate_exception(0x48);
  Iex_3_2::LogicExc::LogicExc(this_00,asStack_198);
  __cxa_throw(this_00,&Iex_3_2::LogicExc::typeinfo,Iex_3_2::LogicExc::~LogicExc);
}

Assistant:

LevelMode
DeepTiledInputFile::levelMode () const
{
    return _data->tileDesc.mode;
}